

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O2

void ctemplate::TemplateDictionary::SetGlobalValue(TemplateString variable,TemplateString value)

{
  int iVar1;
  TemplateString key;
  TemplateString value_00;
  void *__dest;
  bool bVar2;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  TemplateId in_stack_00000020;
  void *in_stack_00000028;
  size_t in_stack_00000030;
  uint7 uStack_27;
  
  __dest = operator_new__(in_stack_00000030 + 1);
  memcpy(__dest,in_stack_00000028,in_stack_00000030);
  *(undefined1 *)((long)__dest + in_stack_00000030) = 0;
  iVar1 = g_once + 1;
  bVar2 = g_once == 0;
  g_once = iVar1;
  if (bVar2) {
    SetupGlobalDict();
  }
  Mutex::Lock((Mutex *)&g_static_mutex);
  key.length_ = in_stack_00000010;
  key.ptr_ = (char *)in_stack_00000008;
  key._16_8_ = in_stack_00000018;
  key.id_ = in_stack_00000020;
  value_00.length_ = in_stack_00000030;
  value_00.ptr_ = (char *)__dest;
  value_00._16_8_ = (ulong)uStack_27 << 8;
  value_00.id_ = 0;
  HashInsert<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>,4,std::equal_to<unsigned_long>,ctemplate::small_map_default_init<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>>>,ctemplate::TemplateString>
            (global_dict_,key,value_00);
  Mutex::Unlock((Mutex *)&g_static_mutex);
  return;
}

Assistant:

LOCKS_EXCLUDED(g_static_mutex) {
  // We can't use memdup here, since we're a static method.  We do a strdup,
  // which is fine, since global_dict_ lives the entire program anyway.
  // It's unnecessary to copy the variable, since HashInsert takes care of
  // that for us.
  char* value_copy = new char[value.length_ + 1];
  memcpy(value_copy, value.ptr_, value.length_);
  value_copy[value.length_] = '\0';

  GoogleOnceInit(&g_once, &SetupGlobalDict);

  MutexLock ml(&g_static_mutex);
  HashInsert(global_dict_,
             variable,
             TemplateString(value_copy, value.length_));
}